

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

void satoko_destroy(solver_t *s)

{
  solver_t *s_local;
  
  vec_uint_free(s->assumptions);
  vec_uint_free(s->final_conflict);
  cdb_free(s->all_clauses);
  vec_uint_free(s->originals);
  vec_uint_free(s->learnts);
  vec_wl_free(s->watches);
  vec_sdbl_free(s->activity);
  heap_free(s->var_order);
  vec_uint_free(s->levels);
  vec_uint_free(s->reasons);
  vec_char_free(s->assigns);
  vec_char_free(s->polarity);
  vec_uint_free(s->trail);
  vec_uint_free(s->trail_lim);
  b_queue_free(s->bq_lbd);
  b_queue_free(s->bq_trail);
  vec_uint_free(s->temp_lits);
  vec_char_free(s->seen);
  vec_uint_free(s->tagged);
  vec_uint_free(s->stack);
  vec_uint_free(s->last_dlevel);
  vec_uint_free(s->stamps);
  if (s->marks != (vec_char_t *)0x0) {
    vec_char_free(s->marks);
  }
  free(s);
  return;
}

Assistant:

void satoko_destroy(solver_t *s)
{
    vec_uint_free(s->assumptions);
    vec_uint_free(s->final_conflict);
    cdb_free(s->all_clauses);
    vec_uint_free(s->originals);
    vec_uint_free(s->learnts);
    vec_wl_free(s->watches);
    vec_act_free(s->activity);
    heap_free(s->var_order);
    vec_uint_free(s->levels);
    vec_uint_free(s->reasons);
    vec_char_free(s->assigns);
    vec_char_free(s->polarity);
    vec_uint_free(s->trail);
    vec_uint_free(s->trail_lim);
    b_queue_free(s->bq_lbd);
    b_queue_free(s->bq_trail);
    vec_uint_free(s->temp_lits);
    vec_char_free(s->seen);
    vec_uint_free(s->tagged);
    vec_uint_free(s->stack);
    vec_uint_free(s->last_dlevel);
    vec_uint_free(s->stamps);
    if (s->marks)
        vec_char_free(s->marks);
    satoko_free(s);
}